

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Table * sqlite3LocateTable(Parse *pParse,u32 flags,char *zName,char *zDbase)

{
  byte *pbVar1;
  sqlite3 *psVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  Table *pMod;
  HashElem *pHVar6;
  Table *pTable;
  char *pcVar7;
  char *pcVar8;
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  psVar2 = pParse->db;
  if (((psVar2->mDbFlags & 0x10) == 0) && (iVar5 = sqlite3ReadSchema(pParse), iVar5 != 0)) {
LAB_00127f3d:
    pMod = (Table *)0x0;
  }
  else {
    pMod = sqlite3FindTable(psVar2,zName,zDbase);
    if (pMod == (Table *)0x0) {
      if (((pParse->prepFlags & 4) == 0) && ((psVar2->init).busy == '\0')) {
        pHVar6 = findElementWithHash(&psVar2->aModule,zName,(uint *)0x0);
        pMod = (Table *)pHVar6->data;
        if (pMod == (Table *)0x0) {
          iVar5 = sqlite3_strnicmp(zName,"pragma_",7);
          if (iVar5 == 0) {
            pMod = (Table *)sqlite3PragmaVtabRegister(psVar2,zName);
          }
          else {
            pMod = (Table *)0x0;
          }
        }
        bVar4 = true;
        if (pMod != (Table *)0x0) {
          pcVar8 = pMod->zName;
          local_40 = (char *)0x0;
          lVar3._0_4_ = pMod->tnum;
          lVar3._4_4_ = pMod->nTabRef;
          if (lVar3 == 0) {
            psVar2 = pParse->db;
            if (((*(long *)(pcVar8 + 8) == 0) || (*(long *)(pcVar8 + 8) == *(long *)(pcVar8 + 0x10))
                ) && (pTable = (Table *)sqlite3DbMallocZero(psVar2,0x68), pTable != (Table *)0x0)) {
              pcVar7 = sqlite3DbStrDup(psVar2,(char *)pMod->aCol);
              pTable->zName = pcVar7;
              if (pcVar7 != (char *)0x0) {
                *(Table **)&pMod->tnum = pTable;
                pTable->nTabRef = 1;
                pTable->eTabType = '\x01';
                pTable->pSchema = psVar2->aDb->pSchema;
                pTable->iPKey = -1;
                pbVar1 = (byte *)((long)&pTable->tabFlags + 1);
                *pbVar1 = *pbVar1 | 0x80;
                pcVar7 = sqlite3DbStrDup(psVar2,pcVar7);
                addModuleArgument(pParse,pTable,pcVar7);
                addModuleArgument(pParse,pTable,(char *)0x0);
                pcVar7 = sqlite3DbStrDup(psVar2,pTable->zName);
                addModuleArgument(pParse,pTable,pcVar7);
                iVar5 = vtabCallConstructor(psVar2,pTable,(Module *)pMod,
                                            *(_func_int_sqlite3_ptr_void_ptr_int_char_ptr_ptr_sqlite3_vtab_ptr_ptr_char_ptr_ptr
                                              **)(pcVar8 + 0x10),&local_40);
                pcVar8 = local_40;
                if (iVar5 != 0) {
                  sqlite3ErrorMsg(pParse,"%s",local_40);
                  if (pcVar8 != (char *)0x0) {
                    sqlite3DbFreeNN(psVar2,pcVar8);
                  }
                  sqlite3VtabEponymousTableClear(psVar2,(Module *)pMod);
                }
                goto LAB_00127daf;
              }
              sqlite3DbFreeNN(psVar2,pTable);
            }
          }
          else {
LAB_00127daf:
            pMod = *(Table **)&pMod->tnum;
            bVar4 = false;
          }
        }
        if (!bVar4) goto LAB_00127f40;
      }
      if ((flags & 2) != 0) goto LAB_00127f3d;
      pParse->checkSchema = '\x01';
      pMod = (Table *)0x0;
    }
    else if ((pMod->eTabType == '\x01') && ((pParse->prepFlags & 4) != 0)) {
      pMod = (Table *)0x0;
    }
    if (pMod == (Table *)0x0) {
      pcVar8 = "no such view";
      if ((flags & 1) == 0) {
        pcVar8 = "no such table";
      }
      if (zDbase == (char *)0x0) {
        sqlite3ErrorMsg(pParse,"%s: %s",pcVar8,zName);
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar8,zDbase,zName);
      }
    }
  }
LAB_00127f40:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pMod;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3LocateTable(
  Parse *pParse,         /* context in which to report errors */
  u32 flags,             /* LOCATE_VIEW or LOCATE_NOERR */
  const char *zName,     /* Name of the table we are looking for */
  const char *zDbase     /* Name of the database.  Might be NULL */
){
  Table *p;
  sqlite3 *db = pParse->db;

  /* Read the database schema. If an error occurs, leave an error message
  ** and code in pParse and return NULL. */
  if( (db->mDbFlags & DBFLAG_SchemaKnownOk)==0
   && SQLITE_OK!=sqlite3ReadSchema(pParse)
  ){
    return 0;
  }

  p = sqlite3FindTable(db, zName, zDbase);
  if( p==0 ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
    /* If zName is the not the name of a table in the schema created using
    ** CREATE, then check to see if it is the name of an virtual table that
    ** can be an eponymous virtual table. */
    if( (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)==0 && db->init.busy==0 ){
      Module *pMod = (Module*)sqlite3HashFind(&db->aModule, zName);
      if( pMod==0 && sqlite3_strnicmp(zName, "pragma_", 7)==0 ){
        pMod = sqlite3PragmaVtabRegister(db, zName);
      }
      if( pMod && sqlite3VtabEponymousTableInit(pParse, pMod) ){
        testcase( pMod->pEpoTab==0 );
        return pMod->pEpoTab;
      }
    }
#endif
    if( flags & LOCATE_NOERR ) return 0;
    pParse->checkSchema = 1;
  }else if( IsVirtual(p) && (pParse->prepFlags & SQLITE_PREPARE_NO_VTAB)!=0 ){
    p = 0;
  }

  if( p==0 ){
    const char *zMsg = flags & LOCATE_VIEW ? "no such view" : "no such table";
    if( zDbase ){
      sqlite3ErrorMsg(pParse, "%s: %s.%s", zMsg, zDbase, zName);
    }else{
      sqlite3ErrorMsg(pParse, "%s: %s", zMsg, zName);
    }
  }else{
    assert( HasRowid(p) || p->iPKey<0 );
  }

  return p;
}